

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-join6.c
# Opt level: O3

void cl_recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *buf,sockaddr *addr,uint flags)

{
  int iVar1;
  
  if (handle == &client || handle == &server) {
    if (flags != 0) goto LAB_001880e5;
    if (nread < 0) goto LAB_001880ea;
    if (nread == 0) {
      if (addr == (sockaddr *)0x0) {
        return;
      }
      goto LAB_001880fe;
    }
    if (addr == (sockaddr *)0x0) goto LAB_001880ef;
    if (nread != 4) goto LAB_001880f4;
    if (*(int *)buf->base == 0x474e4f50) {
      cl_recv_cb_called = cl_recv_cb_called + 1;
      uv_close((uv_handle_t *)handle,close_cb);
      return;
    }
  }
  else {
    cl_recv_cb_cold_1();
LAB_001880e5:
    cl_recv_cb_cold_2();
LAB_001880ea:
    cl_recv_cb_cold_7();
LAB_001880ef:
    cl_recv_cb_cold_5();
LAB_001880f4:
    cl_recv_cb_cold_3();
  }
  cl_recv_cb_cold_4();
LAB_001880fe:
  cl_recv_cb_cold_6();
  iVar1 = uv_is_closing((uv_handle_t *)addr);
  if (iVar1 != 0) {
    return;
  }
  uv_close((uv_handle_t *)addr,(uv_close_cb)0x0);
  return;
}

Assistant:

static void cl_recv_cb(uv_udp_t* handle,
                       ssize_t nread,
                       const uv_buf_t* buf,
                       const struct sockaddr* addr,
                       unsigned flags) {
  CHECK_HANDLE(handle);
  ASSERT(flags == 0);

  if (nread < 0) {
    ASSERT(0 && "unexpected error");
  }

  if (nread == 0) {
    /* Returning unused buffer. Don't count towards cl_recv_cb_called */
    ASSERT_NULL(addr);
    return;
  }

  ASSERT_NOT_NULL(addr);
  ASSERT(nread == 4);
  ASSERT(!memcmp("PING", buf->base, nread));

  cl_recv_cb_called++;

  if (cl_recv_cb_called == 2) {
    /* we are done with the server handle, we can close it */
    uv_close((uv_handle_t*) &server, close_cb);
  } else {
    int r;
    char source_addr[64];

    r = uv_ip6_name((const struct sockaddr_in6*)addr, source_addr, sizeof(source_addr));
    ASSERT(r == 0);

    r = uv_udp_set_membership(&server, MULTICAST_ADDR, INTERFACE_ADDR, UV_LEAVE_GROUP);
    ASSERT(r == 0);

    r = uv_udp_set_source_membership(&server, MULTICAST_ADDR, INTERFACE_ADDR, source_addr, UV_JOIN_GROUP);
    ASSERT(r == 0);

    r = do_send(&req_ss);
    ASSERT(r == 0);
  }
}